

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbeglnativeinterfacehandler.cpp
# Opt level: O0

NativeResourceForWindowFunction __thiscall
QXcbEglNativeInterfaceHandler::nativeResourceFunctionForWindow
          (QXcbEglNativeInterfaceHandler *this,QByteArray *resource)

{
  int iVar1;
  NativeResourceForWindowFunction local_8;
  
  iVar1 = resourceType((QByteArray *)this);
  if (iVar1 == 0) {
    local_8 = eglDisplayForWindow;
  }
  else {
    local_8 = (NativeResourceForWindowFunction)0x0;
  }
  return local_8;
}

Assistant:

QPlatformNativeInterface::NativeResourceForWindowFunction QXcbEglNativeInterfaceHandler::nativeResourceFunctionForWindow(const QByteArray &resource) const
{
    switch (resourceType(resource)) {
    case EglDisplay:
        return eglDisplayForWindow;
    default:
        break;
    }
    return nullptr;
}